

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pushOntoSorter(Parse *pParse,ExprList *pOrderBy,Select *pSelect,int regData)

{
  Vdbe *p;
  int iVar1;
  int p3;
  int iVar2;
  int local_4c;
  int iLimit;
  int addr2;
  int addr1;
  int op;
  int regRecord;
  int regBase;
  int nExpr;
  Vdbe *v;
  int regData_local;
  Select *pSelect_local;
  ExprList *pOrderBy_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  iVar2 = pOrderBy->nExpr;
  iVar1 = sqlite3GetTempRange(pParse,iVar2 + 2);
  p3 = sqlite3GetTempReg(pParse);
  sqlite3ExprCacheClear(pParse);
  sqlite3ExprCodeExprList(pParse,pOrderBy,iVar1,0);
  sqlite3VdbeAddOp2(p,0x37,pOrderBy->iECursor,iVar1 + iVar2);
  sqlite3ExprCodeMove(pParse,regData,iVar1 + iVar2 + 1,1);
  sqlite3VdbeAddOp3(p,0x1f,iVar1,iVar2 + 2,p3);
  if ((pSelect->selFlags & 0x40) == 0) {
    addr2 = 0x61;
  }
  else {
    addr2 = 0x60;
  }
  sqlite3VdbeAddOp2(p,addr2,pOrderBy->iECursor,p3);
  sqlite3ReleaseTempReg(pParse,p3);
  sqlite3ReleaseTempRange(pParse,iVar1,iVar2 + 2);
  if (pSelect->iLimit != 0) {
    if (pSelect->iOffset == 0) {
      local_4c = pSelect->iLimit;
    }
    else {
      local_4c = pSelect->iOffset + 1;
    }
    iVar2 = sqlite3VdbeAddOp1(p,0x7a,local_4c);
    sqlite3VdbeAddOp2(p,0x14,local_4c,-1);
    iVar1 = sqlite3VdbeAddOp0(p,1);
    sqlite3VdbeJumpHere(p,iVar2);
    sqlite3VdbeAddOp1(p,0x43,pOrderBy->iECursor);
    sqlite3VdbeAddOp1(p,0x3b,pOrderBy->iECursor);
    sqlite3VdbeJumpHere(p,iVar1);
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  ExprList *pOrderBy,    /* The ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData            /* Register holding data to be sorted */
){
  Vdbe *v = pParse->pVdbe;
  int nExpr = pOrderBy->nExpr;
  int regBase = sqlite3GetTempRange(pParse, nExpr+2);
  int regRecord = sqlite3GetTempReg(pParse);
  int op;
  sqlite3ExprCacheClear(pParse);
  sqlite3ExprCodeExprList(pParse, pOrderBy, regBase, 0);
  sqlite3VdbeAddOp2(v, OP_Sequence, pOrderBy->iECursor, regBase+nExpr);
  sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+1, 1);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nExpr + 2, regRecord);
  if( pSelect->selFlags & SF_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp2(v, op, pOrderBy->iECursor, regRecord);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3ReleaseTempRange(pParse, regBase, nExpr+2);
  if( pSelect->iLimit ){
    int addr1, addr2;
    int iLimit;
    if( pSelect->iOffset ){
      iLimit = pSelect->iOffset+1;
    }else{
      iLimit = pSelect->iLimit;
    }
    addr1 = sqlite3VdbeAddOp1(v, OP_IfZero, iLimit);
    sqlite3VdbeAddOp2(v, OP_AddImm, iLimit, -1);
    addr2 = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp1(v, OP_Last, pOrderBy->iECursor);
    sqlite3VdbeAddOp1(v, OP_Delete, pOrderBy->iECursor);
    sqlite3VdbeJumpHere(v, addr2);
  }
}